

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

bool __thiscall
Diligent::ThreadPoolImpl::ProcessTask(ThreadPoolImpl *this,Uint32 ThreadId,bool WaitForTask)

{
  mutex *pmVar1;
  atomic<int> *paVar2;
  size_t sVar3;
  const_iterator __position;
  pointer pRVar4;
  bool bVar5;
  RefCountersImpl *pRVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  unique_lock<std::mutex> *this_00;
  RefCountersImpl *pRVar11;
  float fVar12;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  RefCntAutoPtr<Diligent::IAsyncTask> pPrereqTask;
  unique_lock<std::mutex> lock;
  float local_9c;
  undefined1 local_98 [32];
  QueuedTaskInfo local_78;
  Uint32 local_4c;
  unique_lock<std::mutex> local_48;
  RefCountersImpl *local_38;
  
  local_78.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.pTask.m_pObject = (IAsyncTask *)0x0;
  local_78.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pmVar1 = &this->m_TasksQueueMtx;
  local_48._M_owns = false;
  local_4c = ThreadId;
  local_48._M_device = pmVar1;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if (((WaitForTask) && (((this->m_Stop)._M_base._M_i & 1U) == 0)) &&
     ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      std::condition_variable::wait((unique_lock *)&this->m_NextTaskCond);
      if (((this->m_Stop)._M_base._M_i & 1U) != 0) break;
    } while ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
  }
  sVar3 = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar10 = sVar3 == 0 & (this->m_Stop)._M_base._M_i;
  if (bVar10 == 0) {
    if (sVar3 != 0) {
      __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      RefCntAutoPtr<Diligent::IAsyncTask>::operator=
                (&local_78.pTask,
                 (RefCntAutoPtr<Diligent::IAsyncTask> *)&__position._M_node[1]._M_parent);
      pRVar11 = (RefCountersImpl *)__position._M_node[1]._M_left;
      pRVar6 = (RefCountersImpl *)__position._M_node[1]._M_right;
      pRVar4 = *(pointer *)(__position._M_node + 2);
      local_98._0_8_ =
           local_78.Prerequisites.
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           local_78.Prerequisites.
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98._16_8_ =
           local_78.Prerequisites.
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __position._M_node[1]._M_left = (_Base_ptr)0x0;
      __position._M_node[1]._M_right = (_Base_ptr)0x0;
      *(undefined8 *)(__position._M_node + 2) = 0;
      local_78.Prerequisites.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pRVar11;
      local_78.Prerequisites.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pRVar6;
      local_78.Prerequisites.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar4;
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ::~vector((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                 *)local_98);
      LOCK();
      (this->m_NumRunningTasks).super___atomic_base<int>._M_i =
           (this->m_NumRunningTasks).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      std::
      _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
      ::_M_erase_aux(&(this->m_TasksQueue)._M_t,__position);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pRVar4 = local_78.Prerequisites.
             super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_78.pTask.m_pObject == (IAsyncTask *)0x0) goto LAB_0071857e;
    local_38 = (RefCountersImpl *)pmVar1;
    if (local_78.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_78.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_9c = 3.4028235e+38;
LAB_00718492:
      (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[6])(local_78.pTask.m_pObject,2);
      uVar8 = (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[4])
                        (local_78.pTask.m_pObject,(ulong)local_4c);
      (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[6])
                (local_78.pTask.m_pObject,(ulong)uVar8);
      iVar9 = (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[10])();
      bVar5 = true;
      if ((char)iVar9 == '\0') {
        iVar9 = (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[7])();
        if (iVar9 != 1) {
          FormatString<char[67]>
                    ((string *)local_98,
                     (char (*) [67])
                     "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
          DebugAssertionFailed
                    ((Char *)local_98._0_8_,"ProcessTask",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x8d);
          if ((RefCountersImpl *)local_98._0_8_ != (RefCountersImpl *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
          }
        }
        goto LAB_00718529;
      }
    }
    else {
      local_9c = 3.4028235e+38;
      bVar5 = true;
      pRVar11 = (RefCountersImpl *)
                local_78.Prerequisites.
                super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)local_98);
        if ((RefCountersImpl *)local_98._0_8_ != (RefCountersImpl *)0x0) {
          cVar7 = (**(code **)(*(long *)local_98._0_8_ + 0x50))();
          if (cVar7 == '\0') {
            fVar12 = (float)(**(code **)(*(long *)local_98._0_8_ + 0x48))();
            if (local_9c <= fVar12) {
              fVar12 = local_9c;
            }
            bVar5 = false;
            local_9c = fVar12;
          }
          if ((RefCountersImpl *)local_98._0_8_ != (RefCountersImpl *)0x0) {
            (**(code **)(*(long *)local_98._0_8_ + 0x10))();
          }
        }
        pRVar11 = (RefCountersImpl *)(pRVar11->m_ObjectWrapperBuffer + 1);
      } while (pRVar11 != (RefCountersImpl *)pRVar4);
      if (bVar5) goto LAB_00718492;
LAB_00718529:
      bVar5 = false;
    }
    local_98._0_8_ = local_38;
    local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
    local_98[8] = 1;
    LOCK();
    paVar2 = &this->m_NumRunningTasks;
    iVar9 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if (!bVar5) {
      (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
      if (local_9c < extraout_XMM0_Da) {
        (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[8])(local_9c);
      }
      (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
      local_48._M_device = (mutex_type *)CONCAT44(local_48._M_device._4_4_,extraout_XMM0_Da_00);
      std::
      _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::_M_emplace_equal<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)&this->m_TasksQueue,(float *)&local_48,&local_78);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
      std::condition_variable::notify_one();
      goto LAB_0071857e;
    }
    if ((iVar9 == 1) && ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
       ) {
      std::condition_variable::notify_one();
    }
    this_00 = (unique_lock<std::mutex> *)local_98;
  }
  else {
    this_00 = &local_48;
  }
  std::unique_lock<std::mutex>::~unique_lock(this_00);
LAB_0071857e:
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ::~vector(&local_78.Prerequisites);
  if (local_78.pTask.m_pObject != (IAsyncTask *)0x0) {
    (*((local_78.pTask.m_pObject)->super_IObject)._vptr_IObject[2])();
  }
  return (bool)(bVar10 ^ 1);
}

Assistant:

ProcessTask(Uint32 ThreadId, bool WaitForTask) override final
    {
        QueuedTaskInfo TaskInfo;
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            if (WaitForTask)
            {
                // The effects of notify_one()/notify_all() and each of the three atomic parts of
                // wait()/wait_for()/wait_until() (unlock+wait, wakeup, and lock) take place in a
                // single total order that can be viewed as modification order of an atomic variable:
                // the order is specific to this individual condition variable. This makes it impossible
                // for notify_one() to, for example, be delayed and unblock a thread that started waiting
                // just after the call to notify_one() was made.
                m_NextTaskCond.wait(lock,
                                    [this] //
                                    {
                                        return m_Stop.load() || !m_TasksQueue.empty();
                                    } //
                );
            }

            // m_Stop must be accessed under the mutex
            if (m_Stop.load() && m_TasksQueue.empty())
                return false;

            if (!m_TasksQueue.empty())
            {
                auto front = m_TasksQueue.begin();
                TaskInfo   = std::move(front->second);
                // NB: we must increment the running task counter while holding the lock and
                //     before removing the task from the queue, otherwise WaitForAllTasks() may
                //     miss the task.
                m_NumRunningTasks.fetch_add(1);
                m_TasksQueue.erase(front);
            }
        }

        if (TaskInfo.pTask)
        {
            // Check prerequisites
            bool  PrerequisitesMet  = true;
            float MinPrereqPriority = +FLT_MAX;
            for (auto& pPrereq : TaskInfo.Prerequisites)
            {
                if (auto pPrereqTask = pPrereq.Lock())
                {
                    if (!pPrereqTask->IsFinished())
                    {
                        PrerequisitesMet  = false;
                        MinPrereqPriority = std::min(MinPrereqPriority, pPrereqTask->GetPriority());
                    }
                }
            }

            bool TaskFinished = false;
            if (PrerequisitesMet)
            {
                TaskInfo.pTask->SetStatus(ASYNC_TASK_STATUS_RUNNING);
                ASYNC_TASK_STATUS ReturnStatus = TaskInfo.pTask->Run(ThreadId);
                // NB: It is essential to set the task status after the Run() method returns.
                //     This way if the GetStatus() method returns any value other than ASYNC_TASK_STATUS_RUNNING,
                //     it is guaranteed that the task is not executed by any thread.
                TaskInfo.pTask->SetStatus(ReturnStatus);
                TaskFinished = TaskInfo.pTask->IsFinished();
                DEV_CHECK_ERR((TaskFinished || TaskInfo.pTask->GetStatus() == ASYNC_TASK_STATUS_NOT_STARTED),
                              "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
            }

            {
                std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

                const auto NumRunningTasks = m_NumRunningTasks.fetch_add(-1) - 1;

                if (TaskFinished)
                {
                    if (m_TasksQueue.empty() && NumRunningTasks == 0)
                    {
                        m_TasksFinishedCond.notify_one();
                    }
                }
                else
                {
                    // If prerequisites are not met or the task requested to be re-run,
                    // re-enqueue the task with the minimum prerequisite priority
                    if (TaskInfo.pTask->GetPriority() > MinPrereqPriority)
                        TaskInfo.pTask->SetPriority(MinPrereqPriority);
                    m_TasksQueue.emplace(TaskInfo.pTask->GetPriority(), std::move(TaskInfo));
                }
            }

            if (!TaskFinished)
            {
                m_NextTaskCond.notify_one();
            }
        }

        return true;
    }